

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_safe_arena.h
# Opt level: O2

SerialArena * __thiscall
google::protobuf::internal::ThreadSafeArena::GetSerialArena(ThreadSafeArena *this)

{
  SerialArena *pSVar1;
  long in_FS_OFFSET;
  
  if (*(uint64_t *)(in_FS_OFFSET + -0x78) == this->tag_and_id_) {
    return *(SerialArena **)(in_FS_OFFSET + -0x70);
  }
  pSVar1 = GetSerialArenaFallback(this,0x10);
  return pSVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE bool GetSerialArenaFast(SerialArena** arena) {
    // If this thread already owns a block in this arena then try to use that.
    // This fast path optimizes the case where multiple threads allocate from
    // the same arena.
    ThreadCache* tc = &thread_cache();
    if (ABSL_PREDICT_TRUE(tc->last_lifecycle_id_seen == tag_and_id_)) {
      *arena = tc->last_serial_arena;
      return true;
    }
    return false;
  }